

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::InterpolationSequenceRecord<njoy::ENDFtk::section::Type<1,_455>::DecayConstants>::
InterpolationSequenceRecord
          (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<1,_455>::DecayConstants> *this,
          InterpolationRecord *interpolation,
          vector<njoy::ENDFtk::section::Type<1,_455>::DecayConstants,_std::allocator<njoy::ENDFtk::section::Type<1,_455>::DecayConstants>_>
          *sequence)

{
  record::InterpolationBase::InterpolationBase
            ((InterpolationBase *)this,&interpolation->super_InterpolationBase);
  std::
  vector<njoy::ENDFtk::section::Type<1,_455>::DecayConstants,_std::allocator<njoy::ENDFtk::section::Type<1,_455>::DecayConstants>_>
  ::vector(&this->sequence_,sequence);
  verifyNZ(*(uint *)((this->interpolation_).super_InterpolationBase.boundaryIndices.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_finish + -1),
           (uint)(((long)(sequence->
                         super__Vector_base<njoy::ENDFtk::section::Type<1,_455>::DecayConstants,_std::allocator<njoy::ENDFtk::section::Type<1,_455>::DecayConstants>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sequence->
                        super__Vector_base<njoy::ENDFtk::section::Type<1,_455>::DecayConstants,_std::allocator<njoy::ENDFtk::section::Type<1,_455>::DecayConstants>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x48));
  return;
}

Assistant:

InterpolationSequenceRecord ( InterpolationRecord&& interpolation,
                              std::vector< Component >&& sequence ) :
  interpolation_( interpolation ),
  sequence_( sequence ) {

  verifyNZ( this->tab2().NZ(), sequence.size() );
  validateSequence( sequence );
}